

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::cpp::CppGenerator::Generate
          (CppGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  FileDescriptor *file_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  string *psVar8;
  ulong uVar9;
  ZeroCopyOutputStream *pZVar10;
  ZeroCopyOutputStream *pZVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  LogMessage *pLVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar13;
  AnnotationCollector *pAVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string basename;
  string info_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  GeneratedCodeInfo annotations;
  Options file_options;
  FileGenerator file_generator;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d8;
  GeneratorContext *local_5c0;
  string local_5b8;
  undefined1 *local_598;
  long local_590;
  undefined1 local_588 [16];
  string *local_578;
  FileDescriptor *local_570;
  string local_568;
  AnnotationCollector local_548;
  LogMessage *local_540;
  Printer local_538;
  LogMessage local_498;
  undefined1 local_460 [56];
  _Alloc_hider local_428;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  uint local_408;
  _Alloc_hider local_400;
  size_type local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  AccessInfoMap *local_3c0;
  anon_enum_32 local_3b8;
  bool local_3b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  undefined2 local_378;
  FileGenerator local_370;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_07;
  
  local_5d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c0 = generator_context;
  ParseGeneratorParameter(parameter,&local_5d8);
  local_460._0_8_ = local_460 + 0x10;
  local_460._8_8_ = 0;
  local_460[0x10] = '\0';
  local_460[0x20] = false;
  local_460[0x21] = false;
  local_460[0x22] = true;
  local_460[0x23] = false;
  local_460._36_4_ = kNoEnforcement;
  local_460[0x28] = false;
  local_460[0x29] = false;
  local_460[0x2a] = false;
  local_460[0x2f] = true;
  local_460[0x30] = false;
  local_428._M_p = (pointer)&local_418;
  local_420 = 0;
  local_418._M_local_buf[0] = '\0';
  local_408 = 0;
  local_400._M_p = (pointer)&local_3f0;
  local_3f8 = 0;
  local_3f0._M_local_buf[0] = '\0';
  local_3e0._M_p = (pointer)&local_3d0;
  local_3d8 = 0;
  local_3d0._M_local_buf[0] = '\0';
  local_3c0 = (AccessInfoMap *)0x0;
  local_3b8 = kTCTableNever;
  local_3b0 = false;
  local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3a8._M_impl.super__Rb_tree_header._M_header;
  local_3a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_378._0_1_ = false;
  local_378._1_1_ = false;
  local_460._43_4_ = (uint)this->opensource_runtime_ << 8;
  local_578 = error;
  local_570 = file;
  local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_assign((string *)&local_428);
  if (local_5d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_5d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_0023bacf:
    file_00 = local_570;
    if (((bool)local_460[0x20] == true) && (local_460[0x2c] == true)) {
      bVar4 = false;
      std::__cxx11::string::_M_replace
                ((ulong)local_578,0,(char *)local_578->_M_string_length,0x3e4fbf);
    }
    else {
      StripProto(&local_5b8,*(string **)local_570);
      bVar4 = MaybeBootstrap((Options *)local_460,local_5c0,local_460[0x2b],&local_5b8);
      if (!bVar4) {
        FileGenerator::FileGenerator(&local_370,file_00,(Options *)local_460);
        lVar1 = (long)&local_538 + 0x10;
        if ((bool)local_460[0x21] == true) {
          local_538._0_8_ = lVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,local_5b8._M_dataplus._M_p,
                     local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
          std::__cxx11::string::append(&local_538.variable_delimiter_);
          iVar5 = (*local_5c0->_vptr_GeneratorContext[2])();
          pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
          if (local_538._0_8_ != lVar1) {
            operator_delete((void *)local_538._0_8_);
          }
          GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&local_498,(Arena *)0x0,false);
          local_548._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_004dc430;
          local_598 = local_588;
          local_540 = &local_498;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_598,local_5b8._M_dataplus._M_p,
                     local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
          std::__cxx11::string::append((char *)&local_598);
          pAVar14 = &local_548;
          if ((bool)local_460[0x23] == false) {
            pAVar14 = (AnnotationCollector *)0x0;
          }
          io::Printer::Printer(&local_538,pZVar10,'$',pAVar14);
          paVar2 = &local_568.field_2;
          local_568._M_dataplus._M_p = (pointer)paVar2;
          if ((bool)local_460[0x23] == true) {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_568,local_598,local_598 + local_590);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"");
          }
          FileGenerator::GenerateProtoHeader(&local_370,&local_538,&local_568);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != paVar2) {
            operator_delete(local_568._M_dataplus._M_p);
          }
          if ((bool)local_460[0x23] == true) {
            iVar5 = (*local_5c0->_vptr_GeneratorContext[2])(local_5c0,&local_598);
            pZVar11 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar5);
            MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_498,pZVar11);
            if (pZVar11 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar11->_vptr_ZeroCopyOutputStream[1])(pZVar11);
            }
          }
          io::Printer::~Printer(&local_538);
          if (local_598 != local_588) {
            operator_delete(local_598);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&local_498);
          if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
          }
        }
        local_538._0_8_ = lVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_538,local_5b8._M_dataplus._M_p,
                   local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
        std::__cxx11::string::append(&local_538.variable_delimiter_);
        iVar5 = (*local_5c0->_vptr_GeneratorContext[2])();
        pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar5);
        if (local_538._0_8_ != lVar1) {
          operator_delete((void *)local_538._0_8_);
        }
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&local_498,(Arena *)0x0,false);
        local_548._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_004dc430;
        local_598 = local_588;
        local_540 = &local_498;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_598,local_5b8._M_dataplus._M_p,
                   local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
        std::__cxx11::string::append((char *)&local_598);
        pAVar14 = &local_548;
        if ((bool)local_460[0x23] == false) {
          pAVar14 = (AnnotationCollector *)0x0;
        }
        io::Printer::Printer(&local_538,pZVar10,'$',pAVar14);
        paVar2 = &local_568.field_2;
        local_568._M_dataplus._M_p = (pointer)paVar2;
        if ((bool)local_460[0x23] == true) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_568,local_598,local_598 + local_590);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"");
        }
        FileGenerator::GeneratePBHeader(&local_370,&local_538,&local_568);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar2) {
          operator_delete(local_568._M_dataplus._M_p);
        }
        if ((bool)local_460[0x23] == true) {
          iVar5 = (*local_5c0->_vptr_GeneratorContext[2])(local_5c0,&local_598);
          pZVar11 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar5);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_498,pZVar11);
          if (pZVar11 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar11->_vptr_ZeroCopyOutputStream[1])(pZVar11);
          }
        }
        io::Printer::~Printer(&local_538);
        if (local_598 != local_588) {
          operator_delete(local_598);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&local_498);
        if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
        }
        bVar4 = UsingImplicitWeakFields(file_00,(Options *)local_460);
        if (bVar4) {
          local_538._0_8_ = lVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,local_5b8._M_dataplus._M_p,
                     local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
          std::__cxx11::string::append(&local_538.variable_delimiter_);
          iVar5 = (*local_5c0->_vptr_GeneratorContext[2])(local_5c0,&local_538);
          pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar5);
          if (local_538._0_8_ != lVar1) {
            operator_delete((void *)local_538._0_8_);
          }
          io::Printer::Printer(&local_538,pZVar10,'$');
          FileGenerator::GenerateGlobalSource(&local_370,&local_538);
          io::Printer::~Printer(&local_538);
          if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
          }
          uVar17 = (int)((ulong)((long)local_370.extension_generators_.
                                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_370.extension_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                   (int)((ulong)((long)local_370.message_generators_.
                                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_370.message_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
          uVar3 = uVar17;
          if ((0 < (int)local_408) && (uVar3 = local_408, (int)local_408 < (int)uVar17)) {
            internal::LogMessage::LogMessage
                      (&local_498,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_generator.cc"
                       ,0xea);
            pLVar12 = internal::LogMessage::operator<<
                                (&local_498,
                                 "CHECK failed: (num_cc_files) <= (file_options.num_cc_files): ");
            pLVar12 = internal::LogMessage::operator<<
                                (pLVar12,
                                 "There must be at least as many numbered .cc files as messages and extensions."
                                );
            internal::LogFinisher::operator=((LogFinisher *)&local_538,pLVar12);
            internal::LogMessage::~LogMessage(&local_498);
            uVar3 = local_408;
          }
          local_570 = (FileDescriptor *)(ulong)uVar3;
          if ((int)((ulong)((long)local_370.message_generators_.
                                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_370.message_generators_.
                                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
            iVar5 = 0;
          }
          else {
            iVar5 = 0;
            do {
              anon_unknown_8::NumberedCcFileName((string *)&local_538,&local_5b8,iVar5);
              iVar6 = (*local_5c0->_vptr_GeneratorContext[2])(local_5c0,&local_538);
              pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_04,iVar6);
              if (local_538._0_8_ != (long)&local_538 + 0x10U) {
                operator_delete((void *)local_538._0_8_);
              }
              io::Printer::Printer(&local_538,pZVar10,'$');
              FileGenerator::GenerateSourceForMessage(&local_370,iVar5,&local_538);
              io::Printer::~Printer(&local_538);
              if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
                (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
              }
              iVar5 = iVar5 + 1;
            } while (iVar5 < (int)((ulong)((long)local_370.message_generators_.
                                                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_370.message_generators_.
                                                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3));
          }
          if (0 < (int)((ulong)((long)local_370.extension_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_370.extension_generators_.
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
            iVar6 = 0;
            do {
              anon_unknown_8::NumberedCcFileName((string *)&local_538,&local_5b8,iVar5 + iVar6);
              iVar7 = (*local_5c0->_vptr_GeneratorContext[2])(local_5c0,&local_538);
              pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_06,iVar7);
              if (local_538._0_8_ != (long)&local_538 + 0x10U) {
                operator_delete((void *)local_538._0_8_);
              }
              io::Printer::Printer(&local_538,pZVar10,'$');
              FileGenerator::GenerateSourceForExtension(&local_370,iVar6,&local_538);
              io::Printer::~Printer(&local_538);
              if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
                (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
              }
              iVar6 = iVar6 + 1;
            } while (iVar6 < (int)((ulong)((long)local_370.extension_generators_.
                                                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_370.extension_generators_.
                                                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3));
            iVar5 = iVar5 + iVar6;
          }
          iVar6 = (int)local_570;
          if (iVar5 < iVar6) {
            do {
              anon_unknown_8::NumberedCcFileName((string *)&local_538,&local_5b8,iVar5);
              iVar7 = (*local_5c0->_vptr_GeneratorContext[2])(local_5c0,(string *)&local_538);
              plVar13 = (long *)CONCAT44(extraout_var_07,iVar7);
              if (local_538._0_8_ != (long)&local_538 + 0x10U) {
                operator_delete((void *)local_538._0_8_);
              }
              if (plVar13 != (long *)0x0) {
                (**(code **)(*plVar13 + 8))(plVar13);
              }
              iVar5 = iVar5 + 1;
            } while (iVar6 != iVar5);
          }
        }
        else {
          local_538._0_8_ = lVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,local_5b8._M_dataplus._M_p,
                     local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
          std::__cxx11::string::append(&local_538.variable_delimiter_);
          iVar5 = (*local_5c0->_vptr_GeneratorContext[2])(local_5c0,&local_538);
          pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_05,iVar5);
          if (local_538._0_8_ != lVar1) {
            operator_delete((void *)local_538._0_8_);
          }
          io::Printer::Printer(&local_538,pZVar10,'$');
          FileGenerator::GenerateSource(&local_370,&local_538);
          io::Printer::~Printer(&local_538);
          if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
          }
        }
        FileGenerator::~FileGenerator(&local_370);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p);
      }
      bVar4 = true;
    }
LAB_0023c300:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_p != &local_3d0) {
      operator_delete(local_3e0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_p != &local_3f0) {
      operator_delete(local_400._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_p != &local_418) {
      operator_delete(local_428._M_p);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_5d8);
    return bVar4;
  }
  uVar16 = 0;
LAB_0023b6b6:
  iVar5 = std::__cxx11::string::compare
                    ((char *)(local_5d8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar16));
  psVar8 = (string *)local_460;
  if (iVar5 == 0) goto LAB_0023b8ec;
  iVar5 = std::__cxx11::string::compare
                    ((char *)(local_5d8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar16));
  if (iVar5 == 0) {
    local_460[0x20] = true;
  }
  else {
    iVar5 = std::__cxx11::string::compare
                      ((char *)(local_5d8.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar16));
    if (iVar5 == 0) {
      local_460[0x23] = true;
    }
    else {
      iVar5 = std::__cxx11::string::compare
                        ((char *)(local_5d8.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar5 == 0) {
        psVar8 = (string *)&local_400;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)(local_5d8.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar16));
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)(local_5d8.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar16));
          if (iVar5 == 0) {
            local_460._36_4_ = kSpeed;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)(local_5d8.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar16));
            if (iVar5 == 0) {
              local_460._36_4_ = kCodeSize;
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)(local_5d8.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar16));
              if (iVar5 == 0) {
                local_460._36_4_ = kLiteRuntime;
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)(local_5d8.
                                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar16));
                if (iVar5 == 0) {
                  local_460._36_4_ = kLiteRuntime;
                  local_460[0x2a] = true;
                  if (local_5d8.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].second._M_string_length != 0
                     ) {
                    local_408 = strto32_adaptor(local_5d8.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                second._M_dataplus._M_p,(char **)0x0,10);
                  }
                }
                else {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)(local_5d8.
                                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar16));
                  if (iVar5 == 0) {
                    local_460[0x2d] = true;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare
                                      ((char *)(local_5d8.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar16))
                    ;
                    if (iVar5 == 0) {
                      local_3b0 = true;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare
                                        ((char *)(local_5d8.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar16
                                                 ));
                      if (iVar5 == 0) {
                        uVar15 = 0;
                        do {
                          uVar9 = std::__cxx11::string::find_first_of
                                            ((char *)&local_5d8.
                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                  second,0x3e4f04,uVar15);
                          if (uVar9 == 0xffffffffffffffff) {
                            uVar9 = local_5d8.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar16].second.
                                    _M_string_length;
                          }
                          if (uVar15 < uVar9) {
                            std::__cxx11::string::substr
                                      ((ulong)&local_370,
                                       (ulong)&local_5d8.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                               second);
                            std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&local_3a8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_370);
                            if ((undefined1 **)local_370.weak_deps_._M_t._M_impl._0_8_ !=
                                (undefined1 **)((long)&local_370 + 0x10U)) {
                              operator_delete((void *)local_370.weak_deps_._M_t._M_impl._0_8_);
                            }
                          }
                          uVar15 = uVar9 + 1;
                        } while (uVar15 < local_5d8.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar16].second.
                                          _M_string_length);
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare
                                          ((char *)(local_5d8.
                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar16
                                                  ));
                        if (iVar5 == 0) {
                          local_378._0_1_ = true;
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare
                                            ((char *)(local_5d8.
                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar16
                                                  ));
                          if (iVar5 == 0) {
                            local_378._1_1_ = true;
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare
                                              ((char *)(local_5d8.
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar16
                                                  ));
                            if (iVar5 == 0) {
                              local_460[0x28] = true;
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare
                                                ((char *)(local_5d8.
                                                                                                                    
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar16
                                                  ));
                              if (iVar5 == 0) {
                                local_460[0x29] = true;
                                goto LAB_0023b910;
                              }
                              iVar5 = std::__cxx11::string::compare
                                                ((char *)(local_5d8.
                                                                                                                    
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar16
                                                  ));
                              if (iVar5 != 0) {
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_370,"Unknown generator option: ",
                                               &local_5d8.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                first);
LAB_0023c3cd:
                                std::__cxx11::string::operator=
                                          ((string *)local_578,(string *)&local_370);
                                if ((undefined1 **)local_370.weak_deps_._M_t._M_impl._0_8_ !=
                                    (undefined1 **)((long)&local_370 + 0x10U)) {
                                  operator_delete((void *)local_370.weak_deps_._M_t._M_impl._0_8_);
                                }
                                bVar4 = false;
                                goto LAB_0023c300;
                              }
                              iVar5 = std::__cxx11::string::compare
                                                ((char *)&local_5d8.
                                                                                                                    
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                  second);
                              if (iVar5 == 0) {
                                local_3b8 = kTCTableNever;
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare
                                                  ((char *)&local_5d8.
                                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                  second);
                                if (iVar5 == 0) {
                                  local_3b8 = kTCTableGuarded;
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare
                                                    ((char *)&local_5d8.
                                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                  second);
                                  if (iVar5 != 0) {
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_370,
                                                  "Unknown value for experimental_tail_call_table_mode: "
                                                  ,&local_5d8.
                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                  second);
                                    goto LAB_0023c3cd;
                                  }
                                  local_3b8 = kTCTableAlways;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0023b910;
        }
        psVar8 = (string *)&local_3e0;
      }
LAB_0023b8ec:
      std::__cxx11::string::_M_assign(psVar8);
    }
  }
LAB_0023b910:
  uVar16 = uVar16 + 1;
  if ((ulong)((long)local_5d8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_5d8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar16) goto LAB_0023bacf;
  goto LAB_0023b6b6;
}

Assistant:

bool CppGenerator::Generate(const FileDescriptor* file,
                            const std::string& parameter,
                            GeneratorContext* generator_context,
                            std::string* error) const {
  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cpp_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  //
  Options file_options;

  file_options.opensource_runtime = opensource_runtime_;
  file_options.runtime_include_base = runtime_include_base_;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else if (options[i].first == "annotate_headers") {
      file_options.annotate_headers = true;
    } else if (options[i].first == "annotation_pragma_name") {
      file_options.annotation_pragma_name = options[i].second;
    } else if (options[i].first == "annotation_guard_name") {
      file_options.annotation_guard_name = options[i].second;
    } else if (options[i].first == "speed") {
      file_options.enforce_mode = EnforceOptimizeMode::kSpeed;
    } else if (options[i].first == "code_size") {
      file_options.enforce_mode = EnforceOptimizeMode::kCodeSize;
    } else if (options[i].first == "lite") {
      file_options.enforce_mode = EnforceOptimizeMode::kLiteRuntime;
    } else if (options[i].first == "lite_implicit_weak_fields") {
      file_options.enforce_mode = EnforceOptimizeMode::kLiteRuntime;
      file_options.lite_implicit_weak_fields = true;
      if (!options[i].second.empty()) {
        file_options.num_cc_files =
            strto32(options[i].second.c_str(), NULL, 10);
      }
    } else if (options[i].first == "annotate_accessor") {
      file_options.annotate_accessor = true;
    } else if (options[i].first == "inject_field_listener_events") {
      file_options.field_listener_options.inject_field_listener_events = true;
    } else if (options[i].first == "forbidden_field_listener_events") {
      std::size_t pos = 0;
      do {
        std::size_t next_pos = options[i].second.find_first_of("+", pos);
        if (next_pos == std::string::npos) {
          next_pos = options[i].second.size();
        }
        if (next_pos > pos)
          file_options.field_listener_options.forbidden_field_listener_events
              .insert(options[i].second.substr(pos, next_pos - pos));
        pos = next_pos + 1;
      } while (pos < options[i].second.size());
    } else if (options[i].first == "eagerly_verified_lazy") {
      file_options.eagerly_verified_lazy = true;
    } else if (options[i].first == "force_eagerly_verified_lazy") {
      file_options.force_eagerly_verified_lazy = true;
    } else if (options[i].first == "table_driven_parsing") {
      file_options.table_driven_parsing = true;
    } else if (options[i].first == "table_driven_serialization") {
      file_options.table_driven_serialization = true;
    } else if (options[i].first == "experimental_tail_call_table_mode") {
      if (options[i].second == "never") {
        file_options.tctable_mode = Options::kTCTableNever;
      } else if (options[i].second == "guarded") {
        file_options.tctable_mode = Options::kTCTableGuarded;
      } else if (options[i].second == "always") {
        file_options.tctable_mode = Options::kTCTableAlways;
      } else {
        *error = "Unknown value for experimental_tail_call_table_mode: " +
                 options[i].second;
        return false;
      }
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // The safe_boundary_check option controls behavior for Google-internal
  // protobuf APIs.
  if (file_options.safe_boundary_check && file_options.opensource_runtime) {
    *error =
        "The safe_boundary_check option is not supported outside of Google.";
    return false;
  }

  // -----------------------------------------------------------------


  std::string basename = StripProto(file->name());

  if (MaybeBootstrap(file_options, generator_context, file_options.bootstrap,
                     &basename)) {
    return true;
  }

  FileGenerator file_generator(file, file_options);

  // Generate header(s).
  if (file_options.proto_h) {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".proto.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::string info_path = basename + ".proto.h.meta";
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_headers ? &annotation_collector : NULL);
    file_generator.GenerateProtoHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".pb.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::string info_path = basename + ".pb.h.meta";
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_headers ? &annotation_collector : NULL);
    file_generator.GeneratePBHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  // Generate cc file(s).
  if (UsingImplicitWeakFields(file, file_options)) {
    {
      // This is the global .cc file, containing
      // enum/services/tables/reflection
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(basename + ".pb.cc"));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateGlobalSource(&printer);
    }

    int num_cc_files =
        file_generator.NumMessages() + file_generator.NumExtensions();

    // If we're using implicit weak fields then we allow the user to
    // optionally specify how many files to generate, not counting the global
    // pb.cc file. If we have more files than messages, then some files will
    // be generated as empty placeholders.
    if (file_options.num_cc_files > 0) {
      GOOGLE_CHECK_LE(num_cc_files, file_options.num_cc_files)
          << "There must be at least as many numbered .cc files as messages "
             "and extensions.";
      num_cc_files = file_options.num_cc_files;
    }
    int cc_file_number = 0;
    for (int i = 0; i < file_generator.NumMessages(); i++) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number++)));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSourceForMessage(i, &printer);
    }
    for (int i = 0; i < file_generator.NumExtensions(); i++) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number++)));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSourceForExtension(i, &printer);
    }
    // Create empty placeholder files if necessary to match the expected number
    // of files.
    for (; cc_file_number < num_cc_files; ++cc_file_number) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number)));
    }
  } else {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".pb.cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}